

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O2

void HTS_Model_clear(HTS_Model *model)

{
  _HTS_Question *p_Var1;
  _HTS_Tree *p_Var2;
  float **ppfVar3;
  float ***pppfVar4;
  size_t *ptr;
  ulong uVar5;
  HTS_Question *question;
  HTS_Tree *tree;
  ulong uVar6;
  
  question = model->question;
  while (question != (HTS_Question *)0x0) {
    p_Var1 = question->next;
    HTS_Question_clear(question);
    HTS_free(question);
    question = p_Var1;
  }
  tree = model->tree;
  while (tree != (HTS_Tree *)0x0) {
    p_Var2 = tree->next;
    HTS_Tree_clear(tree);
    HTS_free(tree);
    tree = p_Var2;
  }
  if (model->pdf != (float ***)0x0) {
    for (uVar6 = 2; uVar5 = 1, uVar6 <= model->ntree + 1; uVar6 = uVar6 + 1) {
      while( true ) {
        ppfVar3 = model->pdf[uVar6];
        if (model->npdf[uVar6] < uVar5) break;
        HTS_free(ppfVar3[uVar5]);
        uVar5 = uVar5 + 1;
      }
      model->pdf[uVar6] = ppfVar3 + 1;
      HTS_free(model->pdf[uVar6]);
    }
    pppfVar4 = model->pdf;
    model->pdf = pppfVar4 + 2;
    HTS_free(pppfVar4 + 2);
  }
  if (model->npdf != (size_t *)0x0) {
    ptr = model->npdf + 2;
    model->npdf = ptr;
    HTS_free(ptr);
  }
  model->vector_length = 0;
  model->num_windows = 0;
  model->is_msd = '\0';
  model->ntree = 0;
  model->npdf = (size_t *)0x0;
  model->pdf = (float ***)0x0;
  model->tree = (HTS_Tree *)0x0;
  model->question = (HTS_Question *)0x0;
  return;
}

Assistant:

static void HTS_Model_clear(HTS_Model * model)
{
   size_t i, j;
   HTS_Question *question, *next_question;
   HTS_Tree *tree, *next_tree;

   for (question = model->question; question; question = next_question) {
      next_question = question->next;
      HTS_Question_clear(question);
      HTS_free(question);
   }
   for (tree = model->tree; tree; tree = next_tree) {
      next_tree = tree->next;
      HTS_Tree_clear(tree);
      HTS_free(tree);
   }
   if (model->pdf) {
      for (i = 2; i <= model->ntree + 1; i++) {
         for (j = 1; j <= model->npdf[i]; j++) {
            HTS_free(model->pdf[i][j]);
         }
         model->pdf[i]++;
         HTS_free(model->pdf[i]);
      }
      model->pdf += 2;
      HTS_free(model->pdf);
   }
   if (model->npdf) {
      model->npdf += 2;
      HTS_free(model->npdf);
   }
   HTS_Model_initialize(model);
}